

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::writePivots(HModel *this,char *suffix)

{
  _Setprecision _Var1;
  char *pcVar2;
  size_type sVar3;
  ostream *poVar4;
  reference pvVar5;
  reference pvVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  int i;
  int count;
  ofstream output;
  string filename;
  char *in_stack_fffffffffffffd20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd28;
  int local_28c;
  ostream local_280 [528];
  string local_70 [32];
  string local_50 [32];
  string local_30 [48];
  
  std::operator+((char *)local_70,in_RDI);
  std::operator+(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  std::operator+(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_280,pcVar2,_S_out);
  sVar3 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1028));
  poVar4 = std::operator<<(local_280,(string *)(in_RDI + 0x628));
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)sVar3);
  poVar4 = std::operator<<(poVar4,"\t");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(double *)(in_RDI + 0x568));
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  _Var1 = std::setprecision(0xc);
  std::operator<<(local_280,_Var1);
  for (local_28c = 0; local_28c < (int)sVar3; local_28c = local_28c + 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1028),(long)local_28c);
    poVar4 = (ostream *)std::ostream::operator<<(local_280,*pvVar5);
    std::operator<<(poVar4,"\t");
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1040),(long)local_28c);
    poVar4 = (ostream *)std::ostream::operator<<(local_280,*pvVar5);
    std::operator<<(poVar4,"\t");
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1058),(long)local_28c
                       );
    poVar4 = (ostream *)std::ostream::operator<<(local_280,*pvVar6);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_280);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void HModel::writePivots(const char *suffix) {
    string filename = "z-" + modelName + "-" + suffix;
    ofstream output(filename.c_str());
    int count = historyColumnIn.size();
    output << modelName << " " << count << "\t" << totalTime << endl;
    output << setprecision(12);
    for (int i = 0; i < count; i++) {
        output << historyColumnIn[i] << "\t";
        output << historyColumnOut[i] << "\t";
        output << historyAlpha[i] << endl;
    }
    output.close();
}